

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O3

QStringList * __thiscall
QDeviceDiscoveryUDev::scanConnectedDevices
          (QStringList *__return_storage_ptr__,QDeviceDiscoveryUDev *this)

{
  int *piVar1;
  QDebug this_00;
  char cVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  storage_type *psVar10;
  storage_type *psVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QByteArrayView QVar15;
  QString local_88;
  char *local_70;
  QDebug local_68;
  QDebug local_60;
  QtPrivate local_58 [8];
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(long *)(this + 0x18) != 0) {
    uVar5 = udev_enumerate_new();
    udev_enumerate_add_match_subsystem(uVar5,"input");
    udev_enumerate_add_match_subsystem(uVar5,"drm");
    uVar3 = *(uint *)(this + 0x10);
    if ((uVar3 & 1) != 0) {
      udev_enumerate_add_match_property(uVar5,"ID_INPUT_MOUSE","1");
      uVar3 = *(uint *)(this + 0x10);
    }
    if ((uVar3 & 2) != 0) {
      udev_enumerate_add_match_property(uVar5,"ID_INPUT_TOUCHPAD","1");
      uVar3 = *(uint *)(this + 0x10);
    }
    if ((uVar3 & 4) != 0) {
      udev_enumerate_add_match_property(uVar5,"ID_INPUT_TOUCHSCREEN","1");
      uVar3 = *(uint *)(this + 0x10);
    }
    if ((uVar3 & 8) != 0) {
      udev_enumerate_add_match_property(uVar5,"ID_INPUT_KEYBOARD","1");
      udev_enumerate_add_match_property(uVar5,"ID_INPUT_KEY","1");
      uVar3 = *(uint *)(this + 0x10);
    }
    cVar2 = (char)uVar3;
    if ((uVar3 & 0x40) != 0) {
      udev_enumerate_add_match_property(uVar5,"ID_INPUT_TABLET","1");
      cVar2 = (char)*(undefined4 *)(this + 0x10);
    }
    if (cVar2 < '\0') {
      udev_enumerate_add_match_property(uVar5,"ID_INPUT_JOYSTICK","1");
    }
    iVar4 = udev_enumerate_scan_devices(uVar5);
    if (iVar4 == 0) {
      lVar6 = udev_enumerate_get_list_entry(uVar5);
      if (lVar6 != 0) {
        do {
          udev_list_entry_get_name(lVar6);
          uVar7 = udev_device_new_from_syspath(*(undefined8 *)(this + 0x18));
          local_88.d.size._0_4_ = 0xaaaaaaaa;
          local_88.d.size._4_4_ = 0xaaaaaaaa;
          local_88.d.d._0_4_ = 0xaaaaaaaa;
          local_88.d.d._4_4_ = 0xaaaaaaaa;
          local_88.d.ptr._0_4_ = 0xaaaaaaaa;
          local_88.d.ptr._4_4_ = 0xaaaaaaaa;
          lVar8 = udev_device_get_devnode(uVar7);
          if (lVar8 == 0) {
            psVar11 = (storage_type *)0x0;
          }
          else {
            psVar10 = (storage_type *)0xffffffffffffffff;
            do {
              psVar11 = psVar10 + 1;
              pcVar9 = psVar10 + lVar8 + 1;
              psVar10 = psVar11;
            } while (*pcVar9 != '\0');
          }
          QVar12.m_data = psVar11;
          QVar12.m_size = (qsizetype)&local_88;
          QString::fromUtf8(QVar12);
          if ((((byte)this[0x10] & 0xcf) != 0) &&
             (QVar13.m_data = (char *)0x10, QVar13.m_size = (qsizetype)&local_88,
             cVar2 = QString::startsWith(QVar13,0x13a61f), cVar2 != '\0')) {
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,&local_88);
            QList<QString>::end(__return_storage_ptr__);
          }
          if ((((byte)this[0x10] & 0x10) != 0) &&
             (QVar14.m_data = (char *)0xd, QVar14.m_size = (qsizetype)&local_88,
             cVar2 = QString::startsWith(QVar14,0x13a630), cVar2 != '\0')) {
            if (((byte)this[0x10] & 0x20) == 0) {
LAB_0013437d:
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,&local_88);
              QList<QString>::end(__return_storage_ptr__);
            }
            else {
              lVar8 = udev_device_get_parent_with_subsystem_devtype(uVar7,"pci",0);
              if (lVar8 != 0) {
                pcVar9 = (char *)udev_device_get_sysattr_value(lVar8,"boot_vga");
                iVar4 = qstrcmp(pcVar9,"1");
                if (iVar4 == 0) goto LAB_0013437d;
              }
            }
          }
          udev_device_unref(uVar7);
          piVar1 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
            }
          }
          lVar6 = udev_list_entry_get_next(lVar6);
        } while (lVar6 != 0);
      }
      udev_enumerate_unref(uVar5);
      lcDD();
      if (((byte)lcDD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_88.d.d._0_4_ = 2;
        local_88.d.d._4_4_ = 0;
        local_88.d.ptr._0_4_ = 0;
        local_88.d.ptr._4_4_ = 0;
        local_88.d.size._0_4_ = 0;
        local_88.d.size._4_4_ = 0;
        local_70 = lcDD::category.name;
        QMessageLogger::debug();
        this_00.stream = local_68.stream;
        QVar15.m_data = (storage_type *)0x16;
        QVar15.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar15);
        QTextStream::operator<<((QTextStream *)this_00.stream,&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_68.stream,' ');
        }
        *(int *)((QTextStream *)local_68.stream + 0x28) =
             *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
        local_60.stream = (Stream *)0x0;
        QtPrivate::printSequentialContainer<QList<QString>>
                  (local_58,(Stream *)&local_50,"QList",__return_storage_ptr__);
        QDebug::~QDebug((QDebug *)&local_50);
        QDebug::~QDebug((QDebug *)local_58);
        QDebug::~QDebug(&local_60);
        QDebug::~QDebug(&local_68);
      }
    }
    else {
      scanConnectedDevices();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QDeviceDiscoveryUDev::scanConnectedDevices()
{
    QStringList devices;

    if (!m_udev)
        return devices;

    udev_enumerate *ue = udev_enumerate_new(m_udev);
    udev_enumerate_add_match_subsystem(ue, "input");
    udev_enumerate_add_match_subsystem(ue, "drm");

    if (m_types & Device_Mouse)
        udev_enumerate_add_match_property(ue, "ID_INPUT_MOUSE", "1");
    if (m_types & Device_Touchpad)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TOUCHPAD", "1");
    if (m_types & Device_Touchscreen)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TOUCHSCREEN", "1");
    if (m_types & Device_Keyboard) {
        udev_enumerate_add_match_property(ue, "ID_INPUT_KEYBOARD", "1");
        udev_enumerate_add_match_property(ue, "ID_INPUT_KEY", "1");
    }
    if (m_types & Device_Tablet)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TABLET", "1");
    if (m_types & Device_Joystick)
        udev_enumerate_add_match_property(ue, "ID_INPUT_JOYSTICK", "1");

    if (udev_enumerate_scan_devices(ue) != 0) {
        qWarning("Failed to scan devices");
        return devices;
    }

    udev_list_entry *entry;
    udev_list_entry_foreach (entry, udev_enumerate_get_list_entry(ue)) {
        const char *syspath = udev_list_entry_get_name(entry);
        udev_device *udevice = udev_device_new_from_syspath(m_udev, syspath);
        QString candidate = QString::fromUtf8(udev_device_get_devnode(udevice));
        if ((m_types & Device_InputMask) && candidate.startsWith(QT_EVDEV_DEVICE ""_L1))
            devices << candidate;
        if ((m_types & Device_VideoMask) && candidate.startsWith(QT_DRM_DEVICE ""_L1)) {
            if (m_types & Device_DRM_PrimaryGPU) {
                udev_device *pci = udev_device_get_parent_with_subsystem_devtype(udevice, "pci", 0);
                if (pci) {
                    if (qstrcmp(udev_device_get_sysattr_value(pci, "boot_vga"), "1") == 0)
                        devices << candidate;
                }
            } else
                devices << candidate;
        }

        udev_device_unref(udevice);
    }
    udev_enumerate_unref(ue);

    qCDebug(lcDD) << "Found matching devices" << devices;

    return devices;
}